

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHLineTextObject.cpp
# Opt level: O0

QSizeF __thiscall
KDReports::HLineTextObject::intrinsicSize
          (HLineTextObject *this,QTextDocument *doc,int posInDocument,QTextFormat *format)

{
  qreal qVar1;
  double dVar2;
  double dVar3;
  double margin;
  double thickness;
  QSizeF local_60;
  double local_50;
  qreal width;
  QTextFrameFormat f;
  QTextFormat *format_local;
  int posInDocument_local;
  QTextDocument *doc_local;
  HLineTextObject *this_local;
  
  QTextDocument::rootFrame();
  QTextFrame::frameFormat((QTextFrame *)&width);
  local_60.wd = (qreal)QTextDocument::pageSize();
  qVar1 = QSizeF::width(&local_60);
  dVar2 = (double)QTextFrameFormat::leftMargin();
  dVar3 = (double)QTextFrameFormat::rightMargin();
  local_50 = qVar1 - (dVar2 + dVar3);
  dVar2 = (double)QTextFormat::doubleProperty((int)format);
  dVar3 = (double)QTextFormat::doubleProperty((int)format);
  QSizeF::QSizeF((QSizeF *)&this_local,local_50,dVar3 + dVar3 + dVar2);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)&width);
  return _this_local;
}

Assistant:

QSizeF HLineTextObject::intrinsicSize(QTextDocument *doc, int posInDocument, const QTextFormat &format)
{
    Q_UNUSED(posInDocument);

    QTextFrameFormat f = doc->rootFrame()->frameFormat();
    const qreal width = doc->pageSize().width() - (f.leftMargin() + f.rightMargin());

    const double thickness = format.doubleProperty(Thickness);
    const double margin = format.doubleProperty(Margin);
    // qDebug() << "intrinsicSize: thickness=" << thickness << "margin=" << margin;

    return QSizeF(width, thickness + 2 * margin);
}